

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  int in_EDX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *field;
  long lVar2;
  protobuf *this_00;
  long lVar3;
  string local_50;
  
  this_00 = (protobuf *)0x1;
  if (1 < (int)*(uint *)(this->descriptor_ + 0x2c)) {
    this_00 = (protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c);
  }
  SimpleItoa_abi_cxx11_(&local_50,this_00,in_EDX);
  io::Printer::Print(printer,"static const int $classname$_offsets_[$field_count$] = {\n",
                     "classname",&this->classname_,"field_count",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  pDVar1 = this->descriptor_;
  if (0 < *(int *)(pDVar1 + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    field = extraout_RDX;
    do {
      FieldName_abi_cxx11_(&local_50,(cxx *)(*(long *)(pDVar1 + 0x30) + lVar2),field);
      io::Printer::Print(printer,
                         "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
                         "classname",&this->classname_,"name",&local_50);
      field = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        field = extraout_RDX_01;
      }
      lVar3 = lVar3 + 1;
      pDVar1 = this->descriptor_;
      lVar2 = lVar2 + 0x78;
    } while (lVar3 < *(int *)(pDVar1 + 0x2c));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateOffsets(io::Printer* printer) {
  printer->Print(
    "static const int $classname$_offsets_[$field_count$] = {\n",
    "classname", classname_,
    "field_count", SimpleItoa(max(1, descriptor_->field_count())));
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    printer->Print(
      "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
      "classname", classname_,
      "name", FieldName(field));
  }

  printer->Outdent();
  printer->Print("};\n");
}